

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy.c
# Opt level: O0

void proxy_worker_func(worker_handle *wh)

{
  proxy_worker *pw_00;
  void *pvVar1;
  proxy_handle *ppVar2;
  uint uVar3;
  byte bVar4;
  char *pcVar5;
  size_t data_len;
  char local_68 [7];
  uint8_t hash;
  char remote_addr [54];
  proxy_conn_handle *ppStack_28;
  int ret;
  proxy_conn_handle *pc;
  proxy_priv *priv;
  proxy_worker *pw;
  worker_handle *wh_local;
  
  pw_00 = (proxy_worker *)wh->func_ctx;
  pvVar1 = pw_00->ph->priv;
  mutex_lock_shared(&pw_00->mutex);
  if (pw_00->conn_client == (conn_handle *)0x0) {
    proxy_log(pw_00->ph,LOG_LEVEL_ERROR,"New connection was signaled, but no connection was given\n"
             );
    mutex_unlock_shared(&pw_00->mutex);
  }
  else {
    mutex_unlock_shared(&pw_00->mutex);
    conn_get_remote_addr(pw_00->conn_client,local_68);
    proxy_log(pw_00->ph,LOG_LEVEL_DEBUG,"New connection - beginning authorization procedure\n");
    register0x00000000 = proxy_worker_authorize(pw_00);
    if (register0x00000000 < 0) {
      if ((((register0x00000000 == -0x6b) || (register0x00000000 == -0x68)) ||
          (register0x00000000 == -0x20)) || (register0x00000000 == -4)) {
        proxy_log(pw_00->ph,LOG_LEVEL_WARN,
                  "Connection to client was lost before authorization could complete\n");
      }
      else {
        ppVar2 = pw_00->ph;
        uVar3 = -register0x00000000;
        pcVar5 = strerror(-register0x00000000);
        proxy_log(ppVar2,LOG_LEVEL_ERROR,"Authorization failed for client \'%s\' (%d): %s\n",
                  local_68,(ulong)uVar3,pcVar5);
      }
      mutex_lock(&pw_00->mutex);
      conn_free(pw_00->conn_client);
      free(pw_00->conn_client);
      pw_00->conn_client = (conn_handle *)0x0;
      mutex_unlock(&pw_00->mutex);
      mutex_lock((mutex_handle *)((long)pvVar1 + 0x880));
      pw_00->next = *(proxy_worker **)((long)pvVar1 + 0x820);
      *(proxy_worker **)((long)pvVar1 + 0x820) = pw_00;
      mutex_unlock((mutex_handle *)((long)pvVar1 + 0x880));
    }
    else {
      proxy_update_registration(pw_00->ph);
      data_len = strlen(pw_00->callsign);
      bVar4 = pearson_get((uint8_t *)pw_00->callsign,data_len);
      proxy_log(pw_00->ph,LOG_LEVEL_DEBUG,"Searching callsign bucket %u\n",(ulong)bVar4);
      mutex_lock((mutex_handle *)((long)pvVar1 + 0x878));
      if (*(long *)((long)pvVar1 + 8) == 0) {
        mutex_unlock((mutex_handle *)((long)pvVar1 + 0x878));
        proxy_log(pw_00->ph,LOG_LEVEL_ERROR,"Idle slot pool is empty.\n");
      }
      else {
        ppStack_28 = *(proxy_conn_handle **)((long)pvVar1 + (ulong)bVar4 * 8 + 0x18);
        while ((ppStack_28 != (proxy_conn_handle *)0x0 &&
               (register0x00000000 =
                     proxy_conn_accept(ppStack_28,pw_00->conn_client,pw_00->callsign,'\x01'),
               register0x00000000 == -0x10))) {
          ppStack_28 = ppStack_28->next_by_call;
        }
        if (ppStack_28 == (proxy_conn_handle *)0x0) {
          ppStack_28 = *(proxy_conn_handle **)((long)pvVar1 + 8);
          register0x00000000 = proxy_conn_accept(ppStack_28,pw_00->conn_client,pw_00->callsign,'\0')
          ;
        }
        if (stack0xffffffffffffffd4 < 0) {
          mutex_unlock((mutex_handle *)((long)pvVar1 + 0x878));
          ppVar2 = pw_00->ph;
          uVar3 = -stack0xffffffffffffffd4;
          pcVar5 = strerror(-stack0xffffffffffffffd4);
          proxy_log(ppVar2,LOG_LEVEL_ERROR,"Failed to acquire slot (%d): %s\n",(ulong)uVar3,pcVar5);
        }
        else {
          *ppStack_28->prev_ptr = ppStack_28->next;
          if (ppStack_28->next == (proxy_conn_handle *)0x0) {
            *(proxy_conn_handle ***)((long)pvVar1 + 0x10) = ppStack_28->prev_ptr;
          }
          else {
            ppStack_28->next->prev_ptr = ppStack_28->prev_ptr;
          }
          if ((ppStack_28->prev_by_call_ptr != (proxy_conn_handle **)0x0) &&
             (*ppStack_28->prev_by_call_ptr = ppStack_28->next_by_call,
             ppStack_28->next_by_call != (proxy_conn_handle *)0x0)) {
            ppStack_28->next_by_call->prev_by_call_ptr = ppStack_28->prev_by_call_ptr;
          }
          ppStack_28->prev_by_call_ptr =
               (proxy_conn_handle **)((long)pvVar1 + (ulong)bVar4 * 8 + 0x18);
          ppStack_28->next_by_call = *(proxy_conn_handle **)((long)pvVar1 + (ulong)bVar4 * 8 + 0x18)
          ;
          if (ppStack_28->next_by_call != (proxy_conn_handle *)0x0) {
            ppStack_28->next_by_call->prev_by_call_ptr = &ppStack_28->next_by_call;
          }
          *(proxy_conn_handle **)((long)pvVar1 + (ulong)bVar4 * 8 + 0x18) = ppStack_28;
          mutex_unlock((mutex_handle *)((long)pvVar1 + 0x878));
          do {
            register0x00000000 = proxy_conn_process(ppStack_28);
          } while (-1 < register0x00000000);
          proxy_log(pw_00->ph,LOG_LEVEL_INFO,"Disconnected from client \'%s\'.\n",pw_00->callsign);
          proxy_conn_finish(ppStack_28);
          ppStack_28->next = (proxy_conn_handle *)0x0;
          mutex_lock((mutex_handle *)((long)pvVar1 + 0x878));
          ppStack_28->prev_ptr = *(proxy_conn_handle ***)((long)pvVar1 + 0x10);
          **(undefined8 **)((long)pvVar1 + 0x10) = ppStack_28;
          *(proxy_conn_handle ***)((long)pvVar1 + 0x10) = &ppStack_28->next;
          mutex_unlock((mutex_handle *)((long)pvVar1 + 0x878));
        }
      }
      mutex_lock(&pw_00->mutex);
      conn_free(pw_00->conn_client);
      free(pw_00->conn_client);
      pw_00->conn_client = (conn_handle *)0x0;
      mutex_unlock(&pw_00->mutex);
      mutex_lock((mutex_handle *)((long)pvVar1 + 0x880));
      pw_00->next = *(proxy_worker **)((long)pvVar1 + 0x820);
      *(proxy_worker **)((long)pvVar1 + 0x820) = pw_00;
      mutex_unlock((mutex_handle *)((long)pvVar1 + 0x880));
      proxy_update_registration(pw_00->ph);
      proxy_log(pw_00->ph,LOG_LEVEL_DEBUG,"Client worker is returning cleanly.\n");
    }
  }
  return;
}

Assistant:

static void proxy_worker_func(struct worker_handle *wh)
{
	struct proxy_worker *pw = wh->func_ctx;
	struct proxy_priv *priv = pw->ph->priv;
	struct proxy_conn_handle *pc = NULL;
	int ret;
	char remote_addr[54];
	uint8_t hash;

	mutex_lock_shared(&pw->mutex);

	if (pw->conn_client == NULL) {
		proxy_log(pw->ph, LOG_LEVEL_ERROR,
			  "New connection was signaled, but no connection was given\n");

		mutex_unlock_shared(&pw->mutex);

		return;
	}

	mutex_unlock_shared(&pw->mutex);

	conn_get_remote_addr(pw->conn_client, remote_addr);

	proxy_log(pw->ph, LOG_LEVEL_DEBUG,
		  "New connection - beginning authorization procedure\n");

	ret = proxy_worker_authorize(pw);
	if (ret < 0) {
		switch (ret) {
		case -ECONNRESET:
		case -EINTR:
		case -ENOTCONN:
		case -EPIPE:
			proxy_log(pw->ph, LOG_LEVEL_WARN,
				  "Connection to client was lost before authorization could complete\n");
			break;
		default:
			proxy_log(pw->ph, LOG_LEVEL_ERROR,
				  "Authorization failed for client '%s' (%d): %s\n",
				  remote_addr, -ret, strerror(-ret));
		}

		mutex_lock(&pw->mutex);
		conn_free(pw->conn_client);
		free(pw->conn_client);
		pw->conn_client = NULL;
		mutex_unlock(&pw->mutex);

		mutex_lock(&priv->idle_workers_mutex);
		pw->next = priv->idle_workers_head;
		priv->idle_workers_head = pw;
		mutex_unlock(&priv->idle_workers_mutex);

		return;
	}

	proxy_update_registration(pw->ph);

	hash = pearson_get((uint8_t *)pw->callsign, strlen(pw->callsign));
	proxy_log(pw->ph, LOG_LEVEL_DEBUG,
		  "Searching callsign bucket %u\n", hash);

	mutex_lock(&priv->idle_clients_mutex);
	if (priv->idle_clients_head == NULL) {
		mutex_unlock(&priv->idle_clients_mutex);
		proxy_log(pw->ph, LOG_LEVEL_ERROR,
			  "Idle slot pool is empty.\n");
		goto proxy_worker_func_exit;
	}

	pc = priv->clients_by_call[hash];
	/* First, check for a reconnect */
	while (pc != NULL) {
		ret = proxy_conn_accept(pc, pw->conn_client, pw->callsign, 1);
		if (ret != -EBUSY)
			break;
		pc = pc->next_by_call;
	}
	/* Fall back on the oldest available slot */
	if (pc == NULL) {
		pc = priv->idle_clients_head;
		ret = proxy_conn_accept(pc, pw->conn_client, pw->callsign, 0);
	}
	if (ret < 0) {
		mutex_unlock(&priv->idle_clients_mutex);
		proxy_log(pw->ph, LOG_LEVEL_ERROR,
			  "Failed to acquire slot (%d): %s\n",
			  -ret, strerror(-ret));
		goto proxy_worker_func_exit;
	}

	/* Remove the slot from the pool */
	*pc->prev_ptr = pc->next;
	if (pc->next == NULL)
		priv->idle_clients_tail_ptr = pc->prev_ptr;
	else
		pc->next->prev_ptr = pc->prev_ptr;

	/* Remove the slot from the hash map */
	if (pc->prev_by_call_ptr != NULL) {
		*pc->prev_by_call_ptr = pc->next_by_call;
		if (pc->next_by_call)
			pc->next_by_call->prev_by_call_ptr = pc->prev_by_call_ptr;
	}

	/* Add the slot to the hash map */
	pc->prev_by_call_ptr = &priv->clients_by_call[hash];
	pc->next_by_call = priv->clients_by_call[hash];
	if (pc->next_by_call != NULL)
		pc->next_by_call->prev_by_call_ptr = &pc->next_by_call;
	priv->clients_by_call[hash] = pc;
	mutex_unlock(&priv->idle_clients_mutex);

	do {
		ret = proxy_conn_process(pc);
	} while (ret >= 0);

	proxy_log(pw->ph, LOG_LEVEL_INFO,
		  "Disconnected from client '%s'.\n", pw->callsign);

	proxy_conn_finish(pc);

	/* Put the slot back in the pool */
	pc->next = NULL;
	mutex_lock(&priv->idle_clients_mutex);
	pc->prev_ptr = priv->idle_clients_tail_ptr;
	*priv->idle_clients_tail_ptr = pc;
	priv->idle_clients_tail_ptr = &pc->next;
	mutex_unlock(&priv->idle_clients_mutex);

proxy_worker_func_exit:
	mutex_lock(&pw->mutex);
	conn_free(pw->conn_client);
	free(pw->conn_client);
	pw->conn_client = NULL;
	mutex_unlock(&pw->mutex);

	mutex_lock(&priv->idle_workers_mutex);
	pw->next = priv->idle_workers_head;
	priv->idle_workers_head = pw;
	mutex_unlock(&priv->idle_workers_mutex);

	proxy_update_registration(pw->ph);

	proxy_log(pw->ph, LOG_LEVEL_DEBUG,
		  "Client worker is returning cleanly.\n");
}